

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::cancelUntil(Solver *this,int level)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Lit *pLVar4;
  lbool *tbs;
  byte *pbVar5;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  uchar *sig;
  size_t in_R8;
  lbool local_21;
  int local_20;
  int local_1c;
  uint local_18;
  Var x;
  int c;
  int level_local;
  Solver *this_local;
  
  x = level;
  _c = this;
  iVar2 = decisionLevel(this);
  if (x < iVar2) {
    local_18 = vec<Gluco::Lit>::size(&this->trail);
    while( true ) {
      local_18 = local_18 - 1;
      uVar1 = local_18;
      piVar3 = vec<int>::operator[](&this->trail_lim,x);
      if ((int)uVar1 < *piVar3) break;
      pLVar4 = vec<Gluco::Lit>::operator[](&this->trail,local_18);
      local_20 = pLVar4->x;
      local_1c = Gluco::var((Lit)local_20);
      lbool::lbool(&local_21,'\x02');
      tbs = vec<Gluco::lbool>::operator[](&this->assigns,local_1c);
      uVar1 = local_18;
      tbs->value = local_21.value;
      if (this->phase_saving < 2) {
        if (this->phase_saving == 1) {
          tbs = (lbool *)vec<int>::last(&this->trail_lim);
          if (*(int *)tbs < (int)uVar1) goto LAB_0072db58;
        }
      }
      else {
LAB_0072db58:
        sig = (uchar *)(ulong)local_18;
        pLVar4 = vec<Gluco::Lit>::operator[](&this->trail,local_18);
        iVar2 = Gluco::sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar4->x,sig,
                            (size_t *)CONCAT71(extraout_var,extraout_DL),&tbs->value,in_R8);
        pbVar5 = (byte *)vec<char>::operator[](&this->polarity,local_1c);
        *pbVar5 = (byte)iVar2 & 1;
      }
      insertVarOrder(this,local_1c);
    }
    piVar3 = vec<int>::operator[](&this->trail_lim,x);
    this->qhead = *piVar3;
    iVar2 = vec<Gluco::Lit>::size(&this->trail);
    piVar3 = vec<int>::operator[](&this->trail_lim,x);
    vec<Gluco::Lit>::shrink(&this->trail,iVar2 - *piVar3);
    iVar2 = vec<int>::size(&this->trail_lim);
    vec<int>::shrink(&this->trail_lim,iVar2 - x);
  }
  return;
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || ((phase_saving == 1) && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } 
}